

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O2

bool __thiscall
crnlib::qdxt5::create_selector_clusters
          (qdxt5 *this,uint max_selector_clusters,
          vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices)

{
  byte bVar1;
  byte bVar2;
  dxt5_block *pdVar3;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *ptVar4;
  bool bVar5;
  uint j;
  uint uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  uint uVar9;
  vector<unsigned_int> *this_00;
  long lVar10;
  uint x;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint y;
  uint uVar15;
  float *pfVar16;
  uint i;
  float fVar17;
  uint local_ec;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *local_e8;
  vector<crnlib::vector<unsigned_int>_> *local_e0;
  ulong local_d8;
  uint local_cc;
  qdxt5 *local_c8;
  vector<unsigned_int> *local_c0;
  weighted_selector_vec_array selector_vecs [2];
  vector<unsigned_int> selector_vec_remap [2];
  vec16F sv;
  
  selector_vecs[1].m_p = (weighted_vec *)0x0;
  selector_vecs[1].m_size = 0;
  selector_vecs[1].m_capacity = 0;
  selector_vecs[0].m_p = (weighted_vec *)0x0;
  selector_vecs[0].m_size = 0;
  selector_vecs[0].m_capacity = 0;
  selector_vec_remap[1].m_p = (uint *)0x0;
  selector_vec_remap[1].m_size = 0;
  selector_vec_remap[1].m_capacity = 0;
  selector_vec_remap[0].m_p = (uint *)0x0;
  selector_vec_remap[0].m_size = 0;
  selector_vec_remap[0].m_capacity = 0;
  local_e0 = selector_cluster_indices;
  local_cc = max_selector_clusters;
  local_c8 = this;
  for (uVar14 = 0; uVar14 != 2; uVar14 = uVar14 + 1) {
    local_e8 = (threaded_clusterizer<crnlib::vec<16U,_float>_> *)(selector_vecs + uVar14);
    local_c0 = selector_vec_remap + uVar14;
    local_d8 = uVar14;
    for (local_ec = 0; local_ec < this->m_num_blocks; local_ec = local_ec + 1) {
      pdVar3 = this->m_pDst_elements;
      uVar9 = this->m_elements_per_block * local_ec;
      if (uVar14 == pdVar3[uVar9].m_endpoints[0] <= pdVar3[uVar9].m_endpoints[1]) {
        pdVar3 = pdVar3 + uVar9;
        bVar5 = false;
        pfVar16 = sv.m_s;
        for (uVar15 = 0; uVar15 != 4; uVar15 = uVar15 + 1) {
          for (x = 0; x != 4; x = x + 1) {
            uVar6 = dxt5_block::get_selector(pdVar3,x,uVar15);
            puVar8 = &g_dxt5_to_linear;
            if ((pdVar3->m_endpoints[1] < pdVar3->m_endpoints[0]) ||
               (puVar8 = &g_dxt5_alpha6_to_linear, uVar6 < 6)) {
              fVar17 = (float)*(byte *)((long)puVar8 + (ulong)uVar6);
            }
            else {
              bVar5 = true;
              fVar17 = 0.0;
            }
            *pfVar16 = fVar17;
            pfVar16 = pfVar16 + 1;
          }
        }
        uVar14 = local_d8;
        this = local_c8;
        if (!bVar5) {
          bVar1 = pdVar3->m_endpoints[0];
          bVar2 = pdVar3->m_endpoints[1];
          vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::resize
                    ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *
                     )local_e8,*(uint *)&local_e8->m_main_thread_id + 1,false);
          ptVar4 = local_e8;
          iVar11 = (uint)bVar1 - (uint)bVar2;
          uVar12 = iVar11 * iVar11;
          uVar9 = uVar12 >> 3;
          if (0x7ff < uVar9) {
            uVar9 = 0x800;
          }
          if (uVar12 < 8) {
            uVar9 = 1;
          }
          vec<16U,_float>::operator=
                    (&((weighted_vec *)local_e8->m_pTask_pool)
                      [*(uint *)&local_e8->m_main_thread_id - 1].m_vec,&sv);
          ((weighted_vec *)ptVar4->m_pTask_pool)[*(uint *)&ptVar4->m_main_thread_id - 1].m_weight =
               uVar9;
          vector<unsigned_int>::push_back(local_c0,&local_ec);
          uVar14 = local_d8;
          this = local_c8;
        }
      }
    }
  }
  vector<crnlib::vector<unsigned_int>_>::clear(local_e0);
  uVar14 = (ulong)local_cc;
  local_e8 = &this->m_selector_clusterizer;
  uVar13 = 0;
  local_d8 = uVar14;
  do {
    if (uVar13 == 2) {
LAB_0013f094:
      lVar10 = 0x10;
      do {
        vector<unsigned_int>::~vector
                  ((vector<unsigned_int> *)((long)&selector_vec_remap[0].m_p + lVar10));
        lVar10 = lVar10 + -0x10;
      } while (lVar10 != -0x10);
      lVar10 = 0x10;
      do {
        vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::~vector
                  ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)
                   ((long)&selector_vecs[0].m_p + lVar10));
        lVar10 = lVar10 + -0x10;
      } while (lVar10 != -0x10);
      return 1 < uVar13;
    }
    uVar7 = (ulong)selector_vecs[uVar13].m_size;
    if (uVar7 != 0) {
      uVar9 = this->m_num_blocks;
      if (0.01 <= (float)uVar7 / (float)uVar9) {
        uVar9 = (uint)(((ulong)(uVar9 - 1) + uVar7 * uVar14) / (ulong)uVar9);
        if (uVar9 < 0x41) {
          uVar9 = 0x40;
        }
        if (uVar9 < selector_vecs[uVar13].m_size) {
          sv.m_s[0] = 0.0;
          sv.m_s[1] = 0.0;
          sv.m_s[2] = 0.0;
          sv.m_s[3] = 0.0;
          uVar15 = this->m_progress_range + 0x10;
          if (uVar13 == 0) {
            uVar15 = this->m_progress_range;
          }
          this->m_progress_start = uVar15;
          this->m_progress_range = uVar13 == 0 ^ 0x11;
          bVar5 = threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
                            (local_e8,selector_vecs + uVar13,uVar9,
                             (vector<crnlib::vector<unsigned_int>_> *)&sv,
                             generate_codebook_progress_callback,this);
          if (!bVar5) {
            vector<crnlib::vector<unsigned_int>_>::~vector
                      ((vector<crnlib::vector<unsigned_int>_> *)&sv);
            goto LAB_0013f094;
          }
          uVar15 = local_e0->m_size;
          vector<crnlib::vector<unsigned_int>_>::enlarge(local_e0,(uint)sv.m_s[2]);
          for (uVar14 = 0; uVar14 < (sv.m_s._8_8_ & 0xffffffff); uVar14 = uVar14 + 1) {
            this_00 = local_e0->m_p + (uVar15 + (int)uVar14);
            vector<unsigned_int>::swap
                      (this_00,(vector<unsigned_int> *)(uVar14 * 0x10 + sv.m_s._0_8_));
            for (uVar7 = 0; uVar7 < this_00->m_size; uVar7 = uVar7 + 1) {
              this_00->m_p[uVar7] = selector_vec_remap[uVar13].m_p[this_00->m_p[uVar7]];
            }
          }
          vector<crnlib::vector<unsigned_int>_>::~vector
                    ((vector<crnlib::vector<unsigned_int>_> *)&sv);
          this = local_c8;
          uVar14 = local_d8;
        }
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

bool qdxt5::create_selector_clusters(uint max_selector_clusters, crnlib::vector<crnlib::vector<uint> >& selector_cluster_indices) {
  weighted_selector_vec_array selector_vecs[2];
  crnlib::vector<uint> selector_vec_remap[2];

  for (uint block_type = 0; block_type < 2; block_type++) {
    for (uint block_iter = 0; block_iter < m_num_blocks; block_iter++) {
      dxt5_block& dxt5_block = get_block(block_iter);
      if ((uint)dxt5_block.is_alpha6_block() != block_type)
        continue;

      vec16F sv;
      float* pDst = &sv[0];

      bool uses_absolute_values = false;

      for (uint y = 0; y < 4; y++) {
        for (uint x = 0; x < 4; x++) {
          const uint s = dxt5_block.get_selector(x, y);

          float f;
          if (dxt5_block.is_alpha6_block()) {
            if (s >= 6) {
              uses_absolute_values = true;
              f = 0.0f;
            } else
              f = g_dxt5_alpha6_to_linear[s];
          } else
            f = g_dxt5_to_linear[s];

          *pDst++ = f;
        }
      }

      if (uses_absolute_values)
        continue;

      int low_alpha = dxt5_block.get_low_alpha();
      int high_alpha = dxt5_block.get_high_alpha();
      int dist = math::square(low_alpha - high_alpha);

      const uint cAlphaDistToWeight = 8;
      const uint cMaxWeight = 2048;
      uint weight = math::clamp<uint>(dist / cAlphaDistToWeight, 1, cMaxWeight);

      selector_vecs[block_type].resize(selector_vecs[block_type].size() + 1);
      selector_vecs[block_type].back().m_vec = sv;
      selector_vecs[block_type].back().m_weight = weight;

      selector_vec_remap[block_type].push_back(block_iter);
    }
  }

  selector_cluster_indices.clear();

  for (uint block_type = 0; block_type < 2; block_type++) {
    if (selector_vecs[block_type].empty())
      continue;

    if ((selector_vecs[block_type].size() / (float)m_num_blocks) < .01f)
      continue;
    uint max_clusters = static_cast<uint>((math::emulu(selector_vecs[block_type].size(), max_selector_clusters) + (m_num_blocks - 1)) / m_num_blocks);
    max_clusters = math::minimum(math::maximum(64U, max_clusters), selector_vecs[block_type].size());
    if (max_clusters >= selector_vecs[block_type].size())
      continue;

#if QDXT5_DEBUGGING
    trace("max_clusters (%u): %u\n", block_type, max_clusters);
#endif

    crnlib::vector<crnlib::vector<uint> > block_type_selector_cluster_indices;

    if (!block_type) {
      m_progress_start = m_progress_range;
      m_progress_range = 16;
    } else {
      m_progress_start = m_progress_range + 16;
      m_progress_range = 17;
    }

    if (!m_selector_clusterizer.create_clusters(
            selector_vecs[block_type], max_clusters, block_type_selector_cluster_indices, generate_codebook_progress_callback, this)) {
      return false;
    }

    const uint first_cluster = selector_cluster_indices.size();
    selector_cluster_indices.enlarge(block_type_selector_cluster_indices.size());

    for (uint i = 0; i < block_type_selector_cluster_indices.size(); i++) {
      crnlib::vector<uint>& indices = selector_cluster_indices[first_cluster + i];
      indices.swap(block_type_selector_cluster_indices[i]);

      for (uint j = 0; j < indices.size(); j++)
        indices.at(j) = selector_vec_remap[block_type][indices.at(j)];
    }
  }

  return true;
}